

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::PrintTo<bool_const,bool>(pair<const_bool,_bool> *value,ostream *os)

{
  char *pcVar1;
  char *pcVar2;
  char local_22;
  char local_21;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_22,1);
  pcVar1 = "optional_bool: false";
  pcVar2 = "optional_bool: false";
  if ((ulong)value->first != 0) {
    pcVar2 = "Saw json_name: true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2 + 0xf,(ulong)value->first ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  if ((ulong)value->second != 0) {
    pcVar1 = "Saw json_name: true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1 + 0xf,(ulong)value->second ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_21,1);
  return;
}

Assistant:

void PrintTo(const ::std::pair<T1, T2>& value, ::std::ostream* os) {
  *os << '(';
  // We cannot use UniversalPrint(value.first, os) here, as T1 may be
  // a reference type.  The same for printing value.second.
  UniversalPrinter<T1>::Print(value.first, os);
  *os << ", ";
  UniversalPrinter<T2>::Print(value.second, os);
  *os << ')';
}